

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<true> * __thiscall BaseState<true>::Bool(BaseState<true> *this,Context<true> *ctx,bool b)

{
  stringstream *psVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  
  psVar1 = Context<true>::error_abi_cxx11_(ctx);
  psVar1 = psVar1 + 0x10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)psVar1,"Unexpected token: bool (",0x18);
  pcVar2 = "false";
  if ((int)CONCAT71(in_register_00000011,b) != 0) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)psVar1,pcVar2,CONCAT71(in_register_00000011,b) & 0xffffffff ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,")",1);
  return (BaseState<true> *)0x0;
}

Assistant:

virtual BaseState<audit>* Bool(Context<audit>& ctx, bool b)
  {
    ctx.error() << "Unexpected token: bool (" << (b ? "true" : "false") << ")";
    return nullptr;
  }